

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O2

void __thiscall sznet::MinHeap<event>::reserve(MinHeap<event> *this,uint32_t n)

{
  uint uVar1;
  event **ppeVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = this->m_capacity;
  if (uVar1 < n) {
    uVar3 = 8;
    if (uVar1 != 0) {
      uVar3 = uVar1 * 2;
    }
    uVar4 = (ulong)uVar3;
    if (uVar3 <= n) {
      uVar4 = (ulong)n;
    }
    ppeVar2 = (event **)realloc(this->m_ptrArr,uVar4 * 0x18);
    if (ppeVar2 == (event **)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/../../sznet/ds/MinHeap.h"
                    ,0x91,"void sznet::MinHeap<event>::reserve(uint32_t) [T = event]");
    }
    this->m_ptrArr = ppeVar2;
    this->m_capacity = (uint32_t)uVar4;
  }
  return;
}

Assistant:

void reserve(uint32_t n)
	{
		if (m_capacity < n)
		{
			T** p = nullptr;
			uint32_t capacity = m_capacity ? m_capacity * 2 : 8;
			if (capacity < n)
			{
				capacity = n;
			}
			p = (T**)realloc(m_ptrArr, capacity * (sizeof(T)));
			if (!p)
			{
				assert(0);
			}
			m_ptrArr = p;
			m_capacity = capacity;
		}
	}